

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

int StartScanRequestRPLIDAR(RPLIDAR *pRPLIDAR)

{
  int iVar1;
  int local_28;
  int local_24;
  int DataType;
  int SendMode;
  int DataResponseLength;
  uchar reqbuf [2];
  RPLIDAR *pRPLIDAR_local;
  
  SendMode._2_2_ = 0x20a5;
  DataType = 0;
  local_24 = 0;
  local_28 = 0;
  _DataResponseLength = pRPLIDAR;
  iVar1 = WriteAllRS232Port(&pRPLIDAR->RS232Port,(uint8 *)((long)&SendMode + 2),2);
  if (iVar1 == 0) {
    iVar1 = GetResponseDescriptorRPLIDAR(_DataResponseLength,&DataType,&local_24,&local_28);
    if (iVar1 == 0) {
      if (((DataType == 5) && (local_24 == 1)) && (local_28 == 0x81)) {
        pRPLIDAR_local._4_4_ = 0;
      }
      else {
        printf("A RPLIDAR is not responding correctly : Bad response descriptor. \n");
        pRPLIDAR_local._4_4_ = 1;
      }
    }
    else {
      pRPLIDAR_local._4_4_ = 1;
    }
  }
  else {
    printf("Error writing data to a RPLIDAR. \n");
    pRPLIDAR_local._4_4_ = 1;
  }
  return pRPLIDAR_local._4_4_;
}

Assistant:

inline int StartScanRequestRPLIDAR(RPLIDAR* pRPLIDAR)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
	if (SL_IS_FAIL(pRPLIDAR->drv->startScan(false, false)))
	{
		printf("A RPLIDAR is not responding correctly : startScan() failed. \n");
		return EXIT_FAILURE;
	}
	pRPLIDAR->nodes_cache->clear();
#else
	unsigned char reqbuf[] = {START_FLAG1_RPLIDAR,SCAN_REQUEST_RPLIDAR};
	int DataResponseLength = 0, SendMode = 0, DataType = 0;

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}

	// Receive the response descriptor.
	if (GetResponseDescriptorRPLIDAR(pRPLIDAR, &DataResponseLength, &SendMode, &DataType) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Quick check of the response descriptor.
	if ((DataResponseLength != NB_BYTES_SCAN_DATA_RESPONSE_RPLIDAR)||
		(SendMode != SINGLE_REQUEST_MULTIPLE_RESPONSE_SEND_MODE_RPLIDAR)||
		(DataType != MEASUREMENT_RESPONSE_RPLIDAR))
	{ 
		printf("A RPLIDAR is not responding correctly : Bad response descriptor. \n");
		return EXIT_FAILURE;	
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}